

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

bool __thiscall
wallet::LegacyScriptPubKeyMan::SetupGeneration(LegacyScriptPubKeyMan *this,bool force)

{
  bool bVar1;
  int iVar2;
  long in_FS_OFFSET;
  CPubKey local_61;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = CanGenerateKeys(this);
  if (!bVar1 || force) {
    iVar2 = (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage
              [10])();
    if ((char)iVar2 == '\0') {
      GenerateNewSeed(&local_61,this);
      SetHDSeed(this,&local_61);
      bVar1 = NewKeyPool(this);
      goto LAB_001f1f38;
    }
  }
  bVar1 = false;
LAB_001f1f38:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyScriptPubKeyMan::SetupGeneration(bool force)
{
    if ((CanGenerateKeys() && !force) || m_storage.IsLocked()) {
        return false;
    }

    SetHDSeed(GenerateNewSeed());
    if (!NewKeyPool()) {
        return false;
    }
    return true;
}